

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O2

void __thiscall CLayer::Print(CLayer *this,FILE *pFile,int iMode)

{
  undefined8 uVar1;
  longlong lVar2;
  uint uVar3;
  CBoundary *pCVar4;
  int iVar5;
  int iVar6;
  
  if (pFile == (FILE *)0x0) {
    return;
  }
  if ((iMode == 0) || (iMode == 0x20)) {
    iVar5 = GetOverFlow(this,0x40);
    uVar3 = GetOverFlow(this,0x400000);
    lVar2 = (this->super_CObject).m_Key;
    iVar6 = IsHorizontal(this);
    uVar1 = 0x48;
    if (iVar6 == 0) {
      uVar1 = 0x56;
    }
    fprintf((FILE *)pFile,"L%d(%c,%d):o(%3d,%3d)\n",(ulong)(uint)lVar2,uVar1,
            (ulong)(uint)this->m_iMaxCapacity,(ulong)uVar3,iVar5);
  }
  else if ((iMode == 0x40) || (iMode == 0x400)) {
    for (iVar5 = 0; iVar5 < this->m_iMaxBX; iVar5 = iVar5 + 1) {
      for (iVar6 = 0; iVar6 < this->m_iMaxBY; iVar6 = iVar6 + 1) {
        pCVar4 = GetBoundary(this,iVar5,iVar6);
        (*(pCVar4->super_CPoint).super_CObject._vptr_CObject[2])(pCVar4,pFile,(ulong)(uint)iMode);
      }
    }
  }
  else {
    if (iMode != 0x800) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.cpp"
                    ,0x167,"virtual void CLayer::Print(FILE *, int)");
    }
    for (iVar5 = 0; iVar5 < this->m_iMaxBX; iVar5 = iVar5 + 1) {
      for (iVar6 = 0; iVar6 < this->m_iMaxBY; iVar6 = iVar6 + 1) {
        pCVar4 = GetBoundary(this,iVar5,iVar6);
        (*(pCVar4->super_CPoint).super_CObject._vptr_CObject[2])(pCVar4,pFile,0x800);
        fputc(10,(FILE *)pFile);
      }
    }
  }
  fflush((FILE *)pFile);
  return;
}

Assistant:

void CLayer::Print(FILE *pFile, int iMode)
{
	if(pFile==NULL)	return;

	int i,j;
	switch(iMode){
	case PRINT_MODE_CGDUMP:
		for (i=0;i<m_iMaxBX;++i)			
			for (j=0;j<m_iMaxBY;++j)
			{
				GetBoundary(i,j)->Print(pFile,iMode);
				fprintf(pFile,"\n");
			}				
			break;
	case PRINT_MODE_RESULT:
	case PRINT_MODE_OFDUMP:
		for (i=0;i<m_iMaxBX;++i)
			for (j=0;j<m_iMaxBY;++j)
				GetBoundary(i,j)->Print(pFile,iMode);
		break;
	case PRINT_MODE_TEXT:
	case PRINT_MODE_CONGET:
		{	
			int	iMaxOF		=	GetOverFlow(GET_MODE_MAX);
			int	iOverFlow	=	GetOverFlow(GET_MODE_SUM);

			fprintf(pFile,"L%d(%c,%d):o(%3d,%3d)\n",
				Z(),IsHorizontal()? 'H':'V',GetCapacity(GET_MODE_MAX),iOverFlow,iMaxOF);
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	fflush(pFile);
}